

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O0

int test9_grandchild(int argc,char **argv)

{
  int iVar1;
  _union_1457 local_b0;
  sigaction sa;
  char **argv_local;
  int argc_local;
  
  sa.sa_restorer = (_func_void *)argv;
  memset(&local_b0,0,0x98);
  local_b0 = (_union_1457)0x1;
  sigemptyset((sigset_t *)&sa);
  iVar1 = sigaction(2,(sigaction *)&local_b0,(sigaction *)0x0);
  if (-1 < iVar1) {
    fprintf(_stdout,"Output on stdout from grandchild before sleep.\n");
    fprintf(_stderr,"Output on stderr from grandchild before sleep.\n");
    fflush(_stdout);
    fflush(_stderr);
    testProcess_sleep(9);
    fprintf(_stdout,"Output on stdout from grandchild after sleep.\n");
    fprintf(_stderr,"Output on stderr from grandchild after sleep.\n");
    fflush(_stdout);
    fflush(_stderr);
  }
  argv_local._4_4_ = (uint)(-1 >= iVar1);
  return argv_local._4_4_;
}

Assistant:

static int test9_grandchild(int argc, const char* argv[])
{
  /* The grandchild just sleeps for a few seconds while ignoring signals.  */
  (void)argc;
  (void)argv;
#if defined(_WIN32)
  if (!SetConsoleCtrlHandler(test9_grandchild_handler, TRUE)) {
    return 1;
  }
#else
  struct sigaction sa;
  memset(&sa, 0, sizeof(sa));
  sa.sa_handler = SIG_IGN;
  sigemptyset(&sa.sa_mask);
  if (sigaction(SIGINT, &sa, 0) < 0) {
    return 1;
  }
#endif
  fprintf(stdout, "Output on stdout from grandchild before sleep.\n");
  fprintf(stderr, "Output on stderr from grandchild before sleep.\n");
  fflush(stdout);
  fflush(stderr);
  /* Sleep for 9 seconds.  */
  testProcess_sleep(9);
  fprintf(stdout, "Output on stdout from grandchild after sleep.\n");
  fprintf(stderr, "Output on stderr from grandchild after sleep.\n");
  fflush(stdout);
  fflush(stderr);
  return 0;
}